

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_dodge(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float *pfVar7;
  char *pcVar8;
  char *pcVar9;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  char *pcVar10;
  __type_conflict2 _Var11;
  int diff;
  int roll;
  int encumb;
  int str;
  int dexa;
  int dex;
  char *attack;
  char buf2 [4608];
  char buf1 [4608];
  float chance;
  undefined4 in_stack_ffffffffffffdb88;
  int in_stack_ffffffffffffdb8c;
  CHAR_DATA *in_stack_ffffffffffffdb90;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffdb98;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffdba0;
  float in_stack_ffffffffffffdba4;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  float local_244c;
  int local_2448;
  int in_stack_ffffffffffffdbbc;
  undefined4 in_stack_ffffffffffffdbc0;
  undefined4 in_stack_ffffffffffffdbc4;
  char local_2428 [140];
  int in_stack_ffffffffffffdc64;
  undefined1 in_stack_ffffffffffffdc6b;
  int in_stack_ffffffffffffdc6c;
  CHAR_DATA *in_stack_ffffffffffffdc70;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  char local_1228 [4616];
  float local_20 [2];
  CHAR_DATA *local_18;
  CHAR_DATA *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = is_awake(in_RSI);
  if (bVar1) {
    iVar3 = get_skill(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c);
    local_20[0] = (float)((iVar3 * 3) / 10);
    iVar3 = get_curr_stat((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0)
                          ,in_stack_ffffffffffffdbbc);
    iVar4 = get_curr_stat((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0)
                          ,in_stack_ffffffffffffdbbc);
    if (iVar3 < 6) {
      local_20[0] = local_20[0] + 0.0;
    }
    else {
      if (iVar3 < 0xb) {
        iVar5 = iVar3 / 2;
      }
      else if (iVar3 < 0x10) {
        iVar5 = (iVar3 << 1) / 3;
      }
      else {
        iVar5 = iVar3;
        if (iVar3 < 0x15) {
          iVar5 = (iVar3 << 3) / 10;
        }
      }
      local_20[0] = (float)iVar5 + local_20[0];
    }
    local_20[0] = (float)((iVar3 - iVar4) * 2) + local_20[0];
    iVar3 = check_terrain_mastery(in_stack_ffffffffffffdb98);
    local_20[0] = local_20[0] - (float)iVar3;
    iVar3 = check_terrain_mastery(in_stack_ffffffffffffdb98);
    local_20[0] = (float)iVar3 + local_20[0];
    bVar1 = is_affected_room(local_10->in_room,(int)gsn_blanket);
    if (bVar1) {
      local_20[0] = local_20[0] * 0.8;
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    if (((!bVar1) && (iVar3 = check_posture(local_10), iVar3 == -1)) &&
       (bVar1 = style_check((int)in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb8c), bVar1)) {
      local_20[0] = local_20[0] + 20.0;
    }
    bVar1 = is_evil((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    if (((bVar1) && (local_18->level < local_10->level)) &&
       (bVar1 = is_affected(local_10,(int)gsn_awe), bVar1)) {
      local_20[0] = local_20[0] - 20.0;
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    if (!bVar1) {
      iVar3 = check_posture(local_18);
      if ((iVar3 == -1) &&
         (bVar1 = style_check((int)in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb8c), bVar1)) {
        local_20[0] = local_20[0] + 20.0;
      }
      iVar3 = check_posture(local_18);
      if ((iVar3 == 1) &&
         (bVar1 = style_check((int)in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb8c), bVar1)) {
        local_20[0] = local_20[0] - 20.0;
      }
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    if (!bVar1) {
      in_stack_ffffffffffffdba8 = (CHAR_DATA *)local_18->act[0];
      _Var11 = std::pow<int,int>(0,0x5dee97);
      if (((ulong)in_stack_ffffffffffffdba8 & (long)_Var11) != 0) {
        local_20[0] = local_20[0] / 2.0;
      }
    }
    bVar1 = check_entwine(local_18,2);
    if (bVar1) {
      local_20[0] = local_20[0] / 2.0;
    }
    bVar1 = is_affected(local_18,(int)gsn_creeping_tomb);
    if (bVar1) {
      local_20[0] = local_20[0] * 0.75;
    }
    local_20[0] = local_20[0] + (float)(int)local_10->defense_mod;
    sVar2 = get_hitroll((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    local_20[0] = (1.0 - (float)(int)sVar2 / 250.0) * local_20[0];
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    if (!bVar1) {
      iVar3 = armor_weight(in_stack_ffffffffffffdb98);
      bVar1 = check_ease((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88))
      ;
      if (bVar1) {
        in_stack_ffffffffffffdba4 = (float)iVar3 * 0.005;
        iVar4 = get_skill(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c);
        iVar3 = iVar3 - (int)(in_stack_ffffffffffffdba4 * (float)iVar4);
      }
      iVar4 = get_curr_stat((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbc4,iVar3),
                            in_stack_ffffffffffffdbbc);
      local_20[0] = ((float)(((iVar4 + -0x12) * 5 + 300) - iVar3) / 250.0) * local_20[0];
      if (local_20[0] < 0.0) {
        local_20[0] = 0.0;
      }
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    if ((bVar1) ||
       (bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88)),
       bVar1)) {
      local_20[0] = (float)((int)local_18->level - (int)local_10->level) + local_20[0];
    }
    local_20[0] = ((float)(int)local_10->balance + (local_20[0] - (float)(int)local_18->balance)) -
                  (float)local_10->analyze;
    if (local_18->analyzePC == local_10) {
      local_20[0] = (float)local_18->analyze + local_20[0];
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    if ((!bVar1) &&
       (bVar1 = style_check((int)in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb8c), bVar1)) {
      iVar3 = check_evasion(in_stack_ffffffffffffdba8,(int)in_stack_ffffffffffffdba4);
      local_20[0] = (float)iVar3 + local_20[0];
    }
    local_244c = 95.0;
    pfVar7 = std::min<float>(local_20,&local_244c);
    local_20[0] = *pfVar7;
    uVar6 = number_percent();
    if ((float)(int)uVar6 < local_20[0]) {
      local_2448 = (int)local_20[0] - uVar6;
      pcVar8 = get_dam_message(in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb8c);
      pcVar9 = "";
      if (local_2448 < 0xf) {
        pcVar9 = "barely ";
      }
      pcVar10 = "";
      if (0x32 < local_2448) {
        pcVar10 = " with ease";
      }
      sprintf(local_1228,"You %sdodge $n\'s %s%s.",pcVar9,pcVar8,pcVar10);
      pcVar9 = "";
      if (local_2448 < 0xf) {
        pcVar9 = "barely ";
      }
      pcVar10 = "";
      if (0x32 < local_2448) {
        pcVar10 = " with ease";
      }
      sprintf(local_2428,"$N %sdodges your %s%s.",pcVar9,pcVar8,pcVar10);
      ch_00 = (CHAR_DATA *)local_18->wiznet[0];
      _Var11 = std::pow<int,int>(0,0x5df335);
      if (((ulong)ch_00 & (long)_Var11) != 0) {
        sprintf(local_1228,"You dodge $n\'s %s. (%d%% -- %d%% needed)",pcVar8,(ulong)uVar6,
                (ulong)(uint)(int)local_20[0]);
      }
      arg1 = (void *)local_10->wiznet[0];
      _Var11 = std::pow<int,int>(0,0x5df394);
      if (((ulong)arg1 & (long)_Var11) != 0) {
        sprintf(local_2428,"$N dodges your %s. (%d%% -- %d%% needed)",pcVar8,(ulong)uVar6,
                (ulong)(uint)(int)local_20[0]);
      }
      act((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),ch_00,arg1,
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      act((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),ch_00,arg1,
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      check_improve(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
                    (bool)in_stack_ffffffffffffdc6b,in_stack_ffffffffffffdc64);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool check_dodge(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	float chance;
	char buf1[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];
	char *attack;
	int dex, dexa, str;
	int encumb;
	int roll, diff;

	if (!is_awake(victim))
		return false;

	chance = (3 * get_skill(victim, gsn_dodge) / 10);

	dex = get_curr_stat(victim, STAT_DEX);
	dexa = get_curr_stat(ch, STAT_DEX);

	if (dex <= 5)
		chance += 0;
	else if (dex <= 10)
		chance += dex / 2;
	else if (dex <= 15)
		chance += (2 * dex / 3);
	else if (dex <= 20)
		chance += (8 * dex / 10);
	else
		chance += dex;

	chance += (dex - dexa) * 2;
	chance -= check_terrain_mastery(ch);
	chance += check_terrain_mastery(victim);

	if (is_affected_room(ch->in_room, gsn_blanket))
		chance *= 0.8;

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (is_evil(victim) && (ch->level > victim->level) && is_affected(ch, gsn_awe))
		chance -= 20;

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 20;

		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (!is_npc(victim) && IS_SET(victim->act, PLR_MORON))
		chance /= 2;

	if (check_entwine(victim, 2))
		chance /= 2;

	if (is_affected(victim, gsn_creeping_tomb))
		chance *= 0.75;

	chance += ch->defense_mod;
	chance *= (1 - ((float)get_hitroll(ch) / (float)250));

	if (!is_npc(victim))
	{
		encumb = armor_weight(victim);

		if (check_ease(victim))
			encumb -= (int)((float)encumb * (float)0.005 * (float)get_skill(victim, gsn_ease));

		str = get_curr_stat(victim, STAT_STR);
		chance *= (float)(300 + (5 * (str - 18)) - encumb) / (float)250;

		if (chance < 0)
			chance = 0;
	}

	if (is_npc(victim) || is_npc(ch))
		chance += (victim->level - ch->level);

	// chance -= 5*abs((ch->size-victim->size));

	chance -= victim->balance;
	chance += ch->balance;
	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (!is_npc(victim) && style_check(gsn_evasion, victim->pcdata->style))
		chance += check_evasion(victim, (int)chance);

	chance = std::min(chance, (float)95);

	roll = number_percent();

	if (roll >= chance)
		return false;

	diff = (int)chance - roll;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "You %sdodge $n's %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");
	sprintf(buf2, "$N %sdodges your %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");

	if (IS_SET(victim->wiznet, WIZ_PERCENT))
		sprintf(buf1, "You dodge $n's %s. (%d%% -- %d%% needed)", attack, roll, (int)chance);

	if (IS_SET(ch->wiznet, WIZ_PERCENT))
		sprintf(buf2, "$N dodges your %s. (%d%% -- %d%% needed)", attack, roll, (int)chance);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);

	check_improve(victim, gsn_dodge, true, 5);

	return true;
}